

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

int xmlC14NDocSaveTo(xmlDocPtr doc,xmlNodeSetPtr nodes,int mode,xmlChar **inclusive_ns_prefixes,
                    int with_comments,xmlOutputBufferPtr buf)

{
  int iVar1;
  xmlOutputBufferPtr buf_local;
  int with_comments_local;
  xmlChar **inclusive_ns_prefixes_local;
  int mode_local;
  xmlNodeSetPtr nodes_local;
  xmlDocPtr doc_local;
  
  iVar1 = xmlC14NExecute(doc,xmlC14NIsNodeInNodeset,nodes,mode,inclusive_ns_prefixes,with_comments,
                         buf);
  return iVar1;
}

Assistant:

int
xmlC14NDocSaveTo(xmlDocPtr doc, xmlNodeSetPtr nodes,
                 int mode, xmlChar ** inclusive_ns_prefixes,
                 int with_comments, xmlOutputBufferPtr buf) {
    return(xmlC14NExecute(doc,
			xmlC14NIsNodeInNodeset,
			nodes,
			mode,
			inclusive_ns_prefixes,
			with_comments,
			buf));
}